

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalSubscriptMat2x3(ShaderEvalContext *c)

{
  Vector<float,_3> local_68;
  Vector<float,_3> local_5c;
  tcu local_50 [12];
  tcu local_44 [12];
  VecAccess<float,_4,_3> local_38;
  
  local_68.m_data._0_8_ = *(undefined8 *)(c->coords).m_data;
  local_5c.m_data[0] = local_68.m_data[1];
  local_5c.m_data._4_8_ = *(undefined8 *)((c->coords).m_data + 2);
  local_68.m_data[2] = local_5c.m_data[1];
  tcu::operator*(local_50,0.5,&local_5c);
  tcu::operator+(local_44,&local_68,(Vector<float,_3> *)local_50);
  local_38.m_vector = &c->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_44);
  return;
}

Assistant:

void evalSubscriptMat2x3	(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3); }